

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O3

void nesapu_set_mute_mask(void *chip,UINT32 MuteMask)

{
  byte bVar1;
  
  bVar1 = (byte)MuteMask;
  *(byte *)((long)chip + 0x24) = bVar1 & 1;
  *(byte *)((long)chip + 0x4c) = bVar1 >> 1 & 1;
  *(byte *)((long)chip + 0x74) = bVar1 >> 2 & 1;
  *(byte *)((long)chip + 0x97) = bVar1 >> 3 & 1;
  *(byte *)((long)chip + 0xc3) = bVar1 >> 4 & 1;
  return;
}

Assistant:

void nesapu_set_mute_mask(void* chip, UINT32 MuteMask)
{
	nesapu_state *info = (nesapu_state*)chip;
	
	info->APU.squ[0].Muted = (MuteMask >> 0) & 0x01;
	info->APU.squ[1].Muted = (MuteMask >> 1) & 0x01;
	info->APU.tri.Muted = (MuteMask >> 2) & 0x01;
	info->APU.noi.Muted = (MuteMask >> 3) & 0x01;
	info->APU.dpcm.Muted = (MuteMask >> 4) & 0x01;
	
	return;
}